

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O2

void __thiscall
OpenSteer::PolylineSegmentedPath::movePoints
          (PolylineSegmentedPath *this,size_type startIndex,size_type numOfPoints,Vec3 *newPoints)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = startIndex * 0xc;
  sVar2 = numOfPoints;
  while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
    Vec3::operator=((Vec3 *)((long)&((this->points_).
                                     super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->x + lVar3),
                    newPoints);
    lVar3 = lVar3 + 0xc;
    newPoints = newPoints + 1;
  }
  iVar1 = (*(this->super_SegmentedPath).super_Path._vptr_Path[6])(this);
  if ((startIndex == 0) && ((char)iVar1 != '\0')) {
    Vec3::operator=((this->points_).
                    super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1,
                    (this->points_).
                    super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar1 = (*(this->super_SegmentedPath).super_Path._vptr_Path[6])(this);
  anon_unknown.dwarf_d4f59::updateTangentsAndLengths
            (&this->points_,&this->segmentTangents_,&this->segmentLengths_,startIndex,numOfPoints,
             SUB41(iVar1,0));
  return;
}

Assistant:

void 
OpenSteer::PolylineSegmentedPath::movePoints( size_type startIndex,
                                              size_type numOfPoints,
                                              Vec3 const newPoints[] )
{
    assert( ( startIndex < ( pointCount() - ( isCyclic() ? 1 : 0 ) ) ) && 
            "startIndex must be inside index range." );
    assert( ( ( startIndex + numOfPoints ) <= ( pointCount() - ( isCyclic() ? 1 : 0 ) ) ) && 
            "The max. index of a point to set must be inside the index range." ); 
    
    // Update the point positions.
    // @todo Remove this line size_type const pathPointCount = pointCount();
    for ( size_type i = 0; i < numOfPoints; ++i ) {
        points_[ startIndex + i ] = newPoints[ i ];
    }
    
    // If the first point is changed and the path is cyclic also change the
    // last point, which is just a copy of the first point.
    if ( isCyclic() && ( 0 == startIndex ) ) {
        points_.back() = points_.front();
    }
    
    // Recalculate the tangents and lengths.
    updateTangentsAndLengths( points_, 
                              segmentTangents_, 
                              segmentLengths_, 
                              startIndex, 
                              numOfPoints, 
                              isCyclic() );
    
    
    assert( adjacentPathPointsDifferent( points_.begin(), points_.end(), isCyclic() ) && "Adjacent path points must be different." );
}